

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::constant_op_expression_abi_cxx11_(CompilerMSL *this,SPIRConstantOp *cop)

{
  uint *puVar1;
  pointer in_RDX;
  pointer local_20;
  SPIRConstantOp *cop_local;
  CompilerMSL *this_local;
  
  cop_local = cop;
  this_local = this;
  if (in_RDX[3] == 0x74) {
    local_20 = in_RDX;
    add_spv_func_and_recompile((CompilerMSL *)cop,SPVFuncImplQuantizeToF16);
    puVar1 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(local_20 + 4),0);
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)&stack0xffffffffffffffc0,(uint32_t)cop,SUB41(*puVar1,0));
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [18])"spvQuantizeToF16(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc0,(char (*) [2])0x5eaa1a);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  else {
    CompilerGLSL::constant_op_expression_abi_cxx11_(&this->super_CompilerGLSL,cop);
  }
  return this;
}

Assistant:

string CompilerMSL::constant_op_expression(const SPIRConstantOp &cop)
{
	switch (cop.opcode)
	{
	case OpQuantizeToF16:
		add_spv_func_and_recompile(SPVFuncImplQuantizeToF16);
		return join("spvQuantizeToF16(", to_expression(cop.arguments[0]), ")");
	default:
		return CompilerGLSL::constant_op_expression(cop);
	}
}